

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O3

void __thiscall
t_rb_generator::generate_rb_struct_required_validator
          (t_rb_generator *this,t_rb_ofstream *out,t_struct *tstruct)

{
  undefined1 *puVar1;
  t_field *ptVar2;
  ostream *poVar3;
  t_rb_ofstream *ptVar4;
  pointer pptVar5;
  size_type sVar6;
  int iVar7;
  pointer pptVar8;
  pointer pcVar9;
  string local_50;
  
  if (0 < *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                   field_0xf8) {
    iVar7 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
      iVar7 = iVar7 + 1;
    } while (iVar7 < *(int *)&(out->super_ofstream).
                              super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"def validate",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  puVar1 = &(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8;
  *(int *)puVar1 = *(int *)puVar1 + 1;
  pptVar8 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pptVar5 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pptVar8 != pptVar5) {
    do {
      ptVar2 = *pptVar8;
      if (ptVar2->req_ == T_REQUIRED) {
        if (0 < *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                         field_0xf8) {
          iVar7 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
            iVar7 = iVar7 + 1;
          } while (iVar7 < *(int *)&(out->super_ofstream).
                                    super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)out,
                   "raise ::Thrift::ProtocolException.new(::Thrift::ProtocolException::UNKNOWN, \'Required field "
                   ,0x5c);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)out,(ptVar2->name_)._M_dataplus._M_p,
                            (ptVar2->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," is unset!\')",0xc);
        iVar7 = (*(ptVar2->type_->super_t_doc)._vptr_t_doc[8])();
        if ((char)iVar7 == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)out," unless @",9);
          pcVar9 = (ptVar2->name_)._M_dataplus._M_p;
          sVar6 = (ptVar2->name_)._M_string_length;
          ptVar4 = out;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)out," if @",5);
          ptVar4 = (t_rb_ofstream *)
                   std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)out,(ptVar2->name_)._M_dataplus._M_p,
                              (ptVar2->name_)._M_string_length);
          sVar6 = 5;
          pcVar9 = ".nil?";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)ptVar4,pcVar9,sVar6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,
                   ::endl_abi_cxx11_._M_string_length);
        pptVar5 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      pptVar8 = pptVar8 + 1;
    } while (pptVar8 != pptVar5);
    pptVar8 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pptVar8 != pptVar5) {
      do {
        ptVar2 = *pptVar8;
        iVar7 = (*(ptVar2->type_->super_t_doc)._vptr_t_doc[10])();
        if ((char)iVar7 != '\0') {
          if (0 < *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                           field_0xf8) {
            iVar7 = 0;
            do {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
              iVar7 = iVar7 + 1;
            } while (iVar7 < *(int *)&(out->super_ofstream).
                                      super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8)
            ;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"unless @",8);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)out,(ptVar2->name_)._M_dataplus._M_p,
                              (ptVar2->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,".nil? || ",9);
          full_type_name_abi_cxx11_(&local_50,this,ptVar2->type_);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar3,local_50._M_dataplus._M_p,local_50._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,"::VALID_VALUES.include?(@",0x19);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar3,(ptVar2->name_)._M_dataplus._M_p,
                              (ptVar2->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          iVar7 = *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                           field_0xf8;
          *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                   field_0xf8 = iVar7 + 1;
          if (-1 < iVar7) {
            iVar7 = 0;
            do {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
              iVar7 = iVar7 + 1;
            } while (iVar7 < *(int *)&(out->super_ofstream).
                                      super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8)
            ;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)out,
                     "raise ::Thrift::ProtocolException.new(::Thrift::ProtocolException::UNKNOWN, \'Invalid value of field "
                     ,100);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)out,(ptVar2->name_)._M_dataplus._M_p,
                              (ptVar2->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"!\')",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          iVar7 = *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                           field_0xf8;
          *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                   field_0xf8 = iVar7 + -1;
          if (1 < iVar7) {
            iVar7 = 0;
            do {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
              iVar7 = iVar7 + 1;
            } while (iVar7 < *(int *)&(out->super_ofstream).
                                      super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8)
            ;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"end",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,
                     ::endl_abi_cxx11_._M_string_length);
        }
        pptVar8 = pptVar8 + 1;
      } while (pptVar8 !=
               (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
               .super__Vector_impl_data._M_finish);
    }
  }
  iVar7 = *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                   field_0xf8;
  *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8 =
       iVar7 + -1;
  if (1 < iVar7) {
    iVar7 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
      iVar7 = iVar7 + 1;
    } while (iVar7 < *(int *)&(out->super_ofstream).
                              super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"end",3);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_rb_generator::generate_rb_struct_required_validator(t_rb_ofstream& out, t_struct* tstruct) {
  out.indent() << "def validate" << endl;
  out.indent_up();

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    t_field* field = (*f_iter);
    if (field->get_req() == t_field::T_REQUIRED) {
      out.indent() << "raise ::Thrift::ProtocolException.new(::Thrift::ProtocolException::UNKNOWN, "
                      "'Required field " << field->get_name() << " is unset!')";
      if (field->get_type()->is_bool()) {
        out << " if @" << field->get_name() << ".nil?";
      } else {
        out << " unless @" << field->get_name();
      }
      out << endl;
    }
  }

  // if field is an enum, check that its value is valid
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    t_field* field = (*f_iter);

    if (field->get_type()->is_enum()) {
      out.indent() << "unless @" << field->get_name() << ".nil? || "
                   << full_type_name(field->get_type()) << "::VALID_VALUES.include?(@"
                   << field->get_name() << ")" << endl;
      out.indent_up();
      out.indent() << "raise ::Thrift::ProtocolException.new(::Thrift::ProtocolException::UNKNOWN, "
                      "'Invalid value of field " << field->get_name() << "!')" << endl;
      out.indent_down();
      out.indent() << "end" << endl;
    }
  }

  out.indent_down();
  out.indent() << "end" << endl << endl;
}